

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O3

void Aig_RManPrintVarProfile(uint *pTruth,int nVars,uint *pTruthAux)

{
  ulong uVar1;
  int pStore2 [32];
  uint local_98 [32];
  
  Kit_TruthCountOnesInCofsSlow(pTruth,nVars,(int *)local_98,pTruthAux);
  if (0 < nVars) {
    uVar1 = 0;
    do {
      printf("%2d/%2d ",(ulong)local_98[uVar1 * 2],(ulong)local_98[uVar1 * 2 + 1]);
      uVar1 = uVar1 + 1;
    } while ((uint)nVars != uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void Aig_RManPrintVarProfile( unsigned * pTruth, int nVars,  unsigned * pTruthAux )
{
    int pStore2[32];
    int i;
    Kit_TruthCountOnesInCofsSlow( pTruth, nVars, pStore2, pTruthAux );
    for ( i = 0; i < nVars; i++ )
        printf( "%2d/%2d ", pStore2[2*i], pStore2[2*i+1] );
    printf( "\n" );
}